

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

int __thiscall
re2::Regexp::Walker<int>::WalkInternal(Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  ushort uVar1;
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *psVar2;
  int iVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  size_type sVar5;
  _Elt_pointer pWVar6;
  int *piVar7;
  Regexp *pRVar8;
  ulong uVar9;
  bool stop;
  undefined1 local_1b0 [384];
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/walker-inl.h"
               ,0xa4);
    std::operator<<((ostream *)(local_1b0 + 8),"Walk NULL");
    LogMessage::~LogMessage((LogMessage *)local_1b0);
  }
  else {
    local_1b0._8_4_ = -1;
    local_1b0._24_8_ = (int *)0x0;
    local_1b0._0_8_ = re;
    local_1b0._12_4_ = top_arg;
    std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>::
    emplace_back<re2::WalkState<int>>
              ((deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *)this->stack_,
               (WalkState<int> *)local_1b0);
LAB_0019dca5:
    while( true ) {
      psVar2 = this->stack_;
      pWVar6 = (psVar2->c).
               super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl
               .super__Deque_impl_data._M_finish._M_cur;
      if (pWVar6 == (psVar2->c).
                    super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar6 = (psVar2->c).
                 super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pRVar8 = pWVar6[-1].re;
      uVar9 = (ulong)(uint)pWVar6[-1].n;
      if (pWVar6[-1].n == 0xffffffff) break;
LAB_0019dccc:
      uVar1 = pRVar8->nsub_;
      if (uVar1 == 0) {
LAB_0019dd9b:
        top_arg = (*this->_vptr_Walker[3])
                            (this,pRVar8,(ulong)(uint)pWVar6[-1].parent_arg,
                             (ulong)(uint)pWVar6[-1].pre_arg,pWVar6[-1].child_args);
        if ((1 < pRVar8->nsub_) && (pWVar6[-1].child_args != (int *)0x0)) {
          operator_delete__(pWVar6[-1].child_args);
        }
        goto LAB_0019dde2;
      }
      if (uVar1 == 1) {
        paVar4 = &pRVar8->field_5;
      }
      else {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar8->field_5).submany_;
      }
      iVar3 = (int)uVar9;
      if ((int)(uint)uVar1 <= iVar3) goto LAB_0019dd9b;
      if (use_copy && 0 < iVar3) {
        pRVar8 = (Regexp *)paVar4[uVar9].submany_;
        if ((Regexp *)paVar4[iVar3 - 1U].submany_ != pRVar8) goto LAB_0019de3e;
        iVar3 = (*this->_vptr_Walker[4])(this,(ulong)(uint)pWVar6[-1].child_args[iVar3 - 1U]);
        pWVar6[-1].child_args[pWVar6[-1].n] = iVar3;
        pWVar6[-1].n = pWVar6[-1].n + 1;
      }
      else {
        pRVar8 = (Regexp *)paVar4[iVar3].submany_;
LAB_0019de3e:
        local_1b0._12_4_ = pWVar6[-1].pre_arg;
        local_1b0._8_4_ = -1;
        local_1b0._24_8_ = (int *)0x0;
        local_1b0._0_8_ = pRVar8;
        std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>::
        emplace_back<re2::WalkState<int>>
                  ((deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *)this->stack_,
                   (WalkState<int> *)local_1b0);
      }
    }
    iVar3 = this->max_visits_;
    this->max_visits_ = iVar3 + -1;
    if (iVar3 < 1) {
      this->stopped_early_ = true;
      top_arg = (*this->_vptr_Walker[5])(this,pRVar8,(ulong)(uint)pWVar6[-1].parent_arg);
    }
    else {
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
      top_arg = (*this->_vptr_Walker[2])
                          (this,pRVar8,(ulong)(uint)pWVar6[-1].parent_arg,
                           (WalkState<int> *)local_1b0);
      pWVar6[-1].pre_arg = top_arg;
      if (local_1b0[0] == false) {
        pWVar6[-1].n = 0;
        pWVar6[-1].child_args = (int *)0x0;
        uVar1 = pRVar8->nsub_;
        uVar9 = (ulong)uVar1;
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            pWVar6[-1].child_args = &pWVar6[-1].child_arg;
            uVar9 = 0;
          }
          else {
            piVar7 = (int *)operator_new__((ulong)uVar1 << 2);
            pWVar6[-1].child_args = piVar7;
            uVar9 = (ulong)(uint)pWVar6[-1].n;
          }
        }
        goto LAB_0019dccc;
      }
    }
LAB_0019dde2:
    std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::pop_back
              (&this->stack_->c);
    sVar5 = std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::size
                      (&this->stack_->c);
    if (sVar5 != 0) {
      psVar2 = this->stack_;
      pWVar6 = (psVar2->c).
               super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl
               .super__Deque_impl_data._M_finish._M_cur;
      if (pWVar6 == (psVar2->c).
                    super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar6 = (psVar2->c).
                 super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if (pWVar6[-1].child_args == (int *)0x0) {
        piVar7 = &pWVar6[-1].child_arg;
      }
      else {
        piVar7 = pWVar6[-1].child_args + pWVar6[-1].n;
      }
      *piVar7 = top_arg;
      pWVar6[-1].n = pWVar6[-1].n + 1;
      goto LAB_0019dca5;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}